

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O0

void __thiscall
vk::anon_unknown_5::HostPtr::HostPtr
          (HostPtr *this,DeviceInterface *vkd,VkDevice device,VkDeviceMemory memory,
          VkDeviceSize offset,VkDeviceSize size,VkMemoryMapFlags flags)

{
  void *pvVar1;
  VkDeviceSize size_local;
  VkDeviceSize offset_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  HostPtr *this_local;
  VkDeviceMemory memory_local;
  
  this->m_vkd = vkd;
  this->m_device = device;
  (this->m_memory).m_internal = memory.m_internal;
  pvVar1 = mapMemory(vkd,device,memory,offset,size,flags);
  this->m_ptr = pvVar1;
  return;
}

Assistant:

HostPtr::HostPtr (const DeviceInterface& vkd, VkDevice device, VkDeviceMemory memory, VkDeviceSize offset, VkDeviceSize size, VkMemoryMapFlags flags)
	: m_vkd		(vkd)
	, m_device	(device)
	, m_memory	(memory)
	, m_ptr		(mapMemory(vkd, device, memory, offset, size, flags))
{
}